

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cc
# Opt level: O2

ostream * pstack::operator<<(ostream *os,JSON<pstack::ProgramHeaderName,_char> *ph)

{
  int iVar1;
  const_iterator cVar2;
  ostream *poVar3;
  initializer_list<std::pair<const_int,_const_char_*>_> __l;
  _Base_ptr *local_d8;
  less<int> *local_d0;
  allocator_type local_22;
  less<int> local_21;
  
  if (operator<<(std::ostream&,pstack::JSON<pstack::ProgramHeaderName,char>const&)::names == '\0') {
    iVar1 = __cxa_guard_acquire(&operator<<(std::ostream&,pstack::JSON<pstack::ProgramHeaderName,char>const&)
                                 ::names);
    if (iVar1 != 0) {
      memcpy((iterator)&local_d8,&DAT_0019b230,0xb0);
      __l._M_len = 0xb;
      __l._M_array = (iterator)&local_d8;
      std::
      map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>::
      map(&operator<<::names,__l,&local_21,&local_22);
      __cxa_atexit(std::
                   map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
                   ::~map,&operator<<::names,&__dso_handle);
      __cxa_guard_release(&operator<<(std::ostream&,pstack::JSON<pstack::ProgramHeaderName,char>const&)
                           ::names);
    }
  }
  cVar2 = std::
          _Rb_tree<int,_std::pair<const_int,_const_char_*>,_std::_Select1st<std::pair<const_int,_const_char_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
          ::find(&operator<<::names._M_t,&ph->object->type);
  if ((_Rb_tree_header *)cVar2._M_node == &operator<<::names._M_t._M_impl.super__Rb_tree_header) {
    poVar3 = std::operator<<(os,'\"');
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,ph->object->type);
    poVar3 = std::operator<<(poVar3,'\"');
  }
  else {
    local_d8 = &cVar2._M_node[1]._M_parent;
    local_d0 = &local_21;
    local_21 = (less<int>)0x0;
    poVar3 = operator<<(os,(JSON<const_char_*,_char> *)&local_d8);
  }
  return poVar3;
}

Assistant:

std::ostream &operator << (std::ostream &os, const JSON<ProgramHeaderName> &ph)
{
    static const std::map<int, const char *> names = {
#define strpair(x) { x, #x }
        strpair(PT_NULL),
        strpair(PT_LOAD),
        strpair(PT_DYNAMIC),
        strpair(PT_INTERP),
        strpair(PT_NOTE),
        strpair(PT_SHLIB),
        strpair(PT_PHDR),
        strpair(PT_TLS),
        strpair(PT_GNU_EH_FRAME),
        strpair(PT_GNU_STACK),
        strpair(PT_GNU_RELRO)
#undef strpair
    };
    auto namei = names.find(ph.object.type);
    if (namei != names.end())
        return os << json(namei->second);
    return os << '"' << ph.object.type << '"';
}